

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

void Pdr_ManSetPropertyOutput(Pdr_Man_t *p,int k)

{
  Vec_Int_t *p_00;
  int iVar1;
  undefined8 in_RAX;
  sat_solver *s;
  Aig_Obj_t *pObj;
  void *pvVar2;
  int i;
  undefined4 uStack_38;
  int Lit;
  
  _uStack_38 = in_RAX;
  s = Pdr_ManSolver(p,k);
  i = 0;
  do {
    if (p->pAig->nTruePos <= i) {
      sat_solver_compress(s);
      return;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,i);
    if (p->vCexes == (Vec_Ptr_t *)0x0) {
LAB_004790a4:
      p_00 = p->pPars->vOutMap;
      if (p_00 != (Vec_Int_t *)0x0) {
        iVar1 = Vec_IntEntry(p_00,i);
        if (iVar1 == -1) goto LAB_004790ef;
      }
      iVar1 = Pdr_ObjSatVar(p,k,1,pObj);
      _uStack_38 = CONCAT44(iVar1 * 2 + 1,uStack_38);
      iVar1 = sat_solver_addclause(s,&Lit,(lit *)&stack0xffffffffffffffd0);
      if (iVar1 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                      ,0xc1,"void Pdr_ManSetPropertyOutput(Pdr_Man_t *, int)");
      }
    }
    else {
      pvVar2 = Vec_PtrEntry(p->vCexes,i);
      if (pvVar2 == (void *)0x0) goto LAB_004790a4;
    }
LAB_004790ef:
    i = i + 1;
  } while( true );
}

Assistant:

void Pdr_ManSetPropertyOutput( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int Lit, RetValue, i;
    pSat = Pdr_ManSolver(p, k);
    Saig_ManForEachPo( p->pAig, pObj, i )
    {
        // skip solved outputs
        if ( p->vCexes && Vec_PtrEntry(p->vCexes, i) )
            continue;
        // skip timedout outputs
        if ( p->pPars->vOutMap && Vec_IntEntry(p->pPars->vOutMap, i) == -1 )
            continue;
        Lit = toLitCond( Pdr_ObjSatVar(p, k, 1, pObj), 1 ); // neg literal
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
    }
    sat_solver_compress( pSat );
}